

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O0

void __thiscall
HttpdBufferedReader_StringCRLF_Test::TestBody(HttpdBufferedReader_StringCRLF_Test *this)

{
  bool bVar1;
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *pMVar2;
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *pTVar3;
  Message *pMVar4;
  const_reference ptVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *function_impl;
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *function_impl_00;
  char *in_R9;
  error_code eVar8;
  string local_640;
  AssertHelper local_620;
  Message local_618;
  bool local_609;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_5e8 [8];
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> str3;
  AssertHelper local_5a0;
  error_code local_598;
  Message local_588;
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__4;
  gets_result_type s3;
  Message local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4f0;
  Message local_4e8;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_4b8 [8];
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> str2;
  AssertHelper local_470;
  error_code local_468;
  Message local_458;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__2;
  gets_result_type s2;
  Message local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_388 [8];
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> str1;
  string local_358;
  AssertHelper local_338;
  error_code local_330;
  Message local_320;
  bool local_311;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_;
  gets_result_type s1;
  undefined1 local_2a8 [8];
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  br;
  int io;
  refiller_function local_210;
  type local_1f0;
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  local_1d0;
  WithoutMatchers local_1a9;
  Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> local_1a8;
  Matcher<int> local_190;
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  local_178;
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  local_140;
  type local_120;
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  local_100;
  WithoutMatchers local_d9;
  Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> local_d8;
  Matcher<int> local_b0;
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  local_98;
  undefined1 local_60 [8];
  refiller r;
  HttpdBufferedReader_StringCRLF_Test *this_local;
  
  r.gmock12_fill_52.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  refiller::refiller((refiller *)local_60);
  testing::Matcher<int>::Matcher<testing::internal::AnythingMatcher_const&,void>
            (&local_b0,(AnythingMatcher *)&testing::_);
  testing::Matcher<pstore::gsl::span<unsigned_char,-1l>const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<unsigned_char,_1l>const&> *)&local_d8,
             (AnythingMatcher *)&testing::_);
  refiller::gmock_fill(&local_98,(refiller *)local_60,&local_b0,&local_d8);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::operator()(&local_98,&local_d9,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                      ,0x76,"r","fill (_, _)");
  eof();
  testing::
  Invoke<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
            (&local_120,(testing *)&local_140,function_impl);
  testing::
  Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::
  Action<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>,void>
            ((Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)&local_100,&local_120);
  testing::internal::
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::WillRepeatedly(pTVar3,&local_100);
  testing::
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~Action(&local_100);
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~function(&local_120);
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~function(&local_140);
  testing::internal::
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~MockSpec(&local_98);
  testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~Matcher(&local_d8);
  testing::Matcher<int>::~Matcher(&local_b0);
  testing::Matcher<int>::Matcher(&local_190,0);
  testing::Matcher<pstore::gsl::span<unsigned_char,-1l>const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<unsigned_char,_1l>const&> *)&local_1a8,
             (AnythingMatcher *)&testing::_);
  refiller::gmock_fill(&local_178,(refiller *)local_60,&local_190,&local_1a8);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::operator()(&local_178,&local_1a9,(void *)0x0);
  pcVar7 = "r";
  pTVar3 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                      ,0x77,"r","fill (0, _)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&io,"abc\r\ndef",(allocator *)&br.field_0x6f);
  yield_string(&local_210,(string *)&io);
  testing::
  Invoke<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
            (&local_1f0,(testing *)&local_210,function_impl_00);
  testing::
  Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::
  Action<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>,void>
            ((Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)&local_1d0,&local_1f0);
  testing::internal::
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::WillOnce(pTVar3,&local_1d0);
  testing::
  Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~Action(&local_1d0);
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~function(&local_1f0);
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~function(&local_210);
  std::__cxx11::string::~string((string *)&io);
  std::allocator<char>::~allocator((allocator<char> *)&br.field_0x6f);
  testing::internal::
  MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~MockSpec(&local_178);
  testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~Matcher(&local_1a8);
  testing::Matcher<int>::~Matcher(&local_190);
  br.is_eof_ = false;
  br.push_.valid_ = false;
  br.push_.storage_ = (type)0x0;
  br._107_1_ = 0;
  refiller::refill_function((refiller_function *)&s1.has_error_,(refiller *)local_60);
  pstore::http::
  make_buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
            ((buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
              *)local_2a8,(http *)&s1.has_error_,
             (function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)0x1000,(size_t)pcVar7);
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::~function((function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
               *)&s1.has_error_);
  pstore::http::
  buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
  ::gets_abi_cxx11_((buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
                     *)&gtest_ar_.message_,local_2a8);
  local_311 = pstore::error_or::operator_cast_to_bool((error_or *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_310,&local_311,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pMVar4 = testing::Message::operator<<
                       (&local_320,(char (*) [32])"There was an unexpected error: ");
    eVar8 = pstore::
            error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
            ::get_error((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                         *)&gtest_ar_.message_);
    local_330._M_cat = eVar8._M_cat;
    local_330._M_value = eVar8._M_value;
    pMVar4 = testing::Message::operator<<(pMVar4,&local_330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_358,(internal *)local_310,(AssertionResult *)"static_cast<bool> (s1)","false",
               "true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
               ,0x7d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_338,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    testing::Message::~Message(&local_320);
  }
  str1.storage_._29_3_ = 0;
  str1.storage_.__data[0x1c] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  if (str1.storage_._28_4_ == 0) {
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *)local_388);
    ptVar5 = pstore::
             error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
             ::operator*((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                          *)&gtest_ar_.message_);
    std::tie<int,pstore::maybe<std::__cxx11::string,void>>
              ((int *)&gtest_ar__1.message_,
               (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *)&br.is_eof_);
    std::tuple<int&,pstore::maybe<std::__cxx11::string,void>&>::operator=
              ((tuple<int&,pstore::maybe<std::__cxx11::string,void>&> *)&gtest_ar__1.message_,ptVar5
              );
    local_3a9 = pstore::
                maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                ::has_value((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                             *)local_388);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
    if (!bVar1) {
      testing::Message::Message(&local_3b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_3a8,
                 (AssertionResult *)"str1.has_value ()","false","true",in_R9);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0x81,pcVar7);
      testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
      testing::internal::AssertHelper::~AssertHelper(&local_3c0);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_3b8);
    }
    str1.storage_._29_3_ = 0;
    str1.storage_.__data[0x1c] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    if (str1.storage_._28_4_ == 0) {
      pbVar6 = pstore::
               maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               ::value((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)local_388);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
                ((EqHelper *)local_3f0,"str1.value ()","\"abc\"",pbVar6,(char (*) [4])"abc");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
      if (!bVar1) {
        testing::Message::Message(&local_3f8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&s2.has_error_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                   ,0x82,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&s2.has_error_,&local_3f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s2.has_error_);
        testing::Message::~Message(&local_3f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
      str1.storage_._28_4_ = 0;
    }
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    ~maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            *)local_388);
  }
  pstore::
  error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
  ::~error_or((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
               *)&gtest_ar_.message_);
  if (str1.storage_._28_4_ == 0) {
    pstore::http::
    buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
    ::gets_abi_cxx11_((buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
                       *)&gtest_ar__2.message_,local_2a8);
    local_449 = pstore::error_or::operator_cast_to_bool((error_or *)&gtest_ar__2.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_448,&local_449,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
    if (!bVar1) {
      testing::Message::Message(&local_458);
      pMVar4 = testing::Message::operator<<
                         (&local_458,(char (*) [32])"There was an unexpected error: ");
      eVar8 = pstore::
              error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
              ::get_error((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                           *)&gtest_ar__2.message_);
      local_468._M_cat = eVar8._M_cat;
      local_468._M_value = eVar8._M_value;
      pMVar4 = testing::Message::operator<<(pMVar4,&local_468);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)((long)&str2.storage_ + 0x18),(internal *)local_448,
                 (AssertionResult *)"static_cast<bool> (s2)","false","true",in_R9);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0x86,pcVar7);
      testing::internal::AssertHelper::operator=(&local_470,pMVar4);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      std::__cxx11::string::~string((string *)(str2.storage_.__data + 0x18));
      testing::Message::~Message(&local_458);
    }
    str1.storage_._29_3_ = 0;
    str1.storage_.__data[0x1c] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
    if (str1.storage_._28_4_ == 0) {
      pstore::
      maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             *)local_4b8);
      ptVar5 = pstore::
               error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
               ::operator*((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                            *)&gtest_ar__2.message_);
      std::tie<int,pstore::maybe<std::__cxx11::string,void>>
                ((int *)&gtest_ar__3.message_,
                 (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *)&br.is_eof_);
      std::tuple<int&,pstore::maybe<std::__cxx11::string,void>&>::operator=
                ((tuple<int&,pstore::maybe<std::__cxx11::string,void>&> *)&gtest_ar__3.message_,
                 ptVar5);
      local_4d9 = pstore::
                  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  ::has_value((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                               *)local_4b8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
      if (!bVar1) {
        testing::Message::Message(&local_4e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_4d8,
                   (AssertionResult *)"str2.has_value ()","false","true",in_R9);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_4f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                   ,0x8a,pcVar7);
        testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
        testing::internal::AssertHelper::~AssertHelper(&local_4f0);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_4e8);
      }
      str1.storage_._29_3_ = 0;
      str1.storage_.__data[0x1c] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
      if (str1.storage_._28_4_ == 0) {
        pbVar6 = pstore::
                 maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 ::value((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)local_4b8);
        testing::internal::EqHelper::
        Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
                  ((EqHelper *)local_520,"str2.value ()","\"def\"",pbVar6,(char (*) [4])0x212ba2);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
        if (!bVar1) {
          testing::Message::Message(&local_528);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&s3.has_error_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                     ,0x8b,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&s3.has_error_,&local_528);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s3.has_error_);
          testing::Message::~Message(&local_528);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
        str1.storage_._28_4_ = 0;
      }
      pstore::
      maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      ~maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)local_4b8);
    }
    pstore::
    error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
    ::~error_or((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                 *)&gtest_ar__2.message_);
    if (str1.storage_._28_4_ == 0) {
      pstore::http::
      buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
      ::gets_abi_cxx11_((buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
                         *)&gtest_ar__4.message_,local_2a8);
      local_579 = pstore::error_or::operator_cast_to_bool((error_or *)&gtest_ar__4.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_578,&local_579,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
      if (!bVar1) {
        testing::Message::Message(&local_588);
        pMVar4 = testing::Message::operator<<
                           (&local_588,(char (*) [32])"There was an unexpected error: ");
        eVar8 = pstore::
                error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                ::get_error((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                             *)&gtest_ar__4.message_);
        local_598._M_cat = eVar8._M_cat;
        local_598._M_value = eVar8._M_value;
        pMVar4 = testing::Message::operator<<(pMVar4,&local_598);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)((long)&str3.storage_ + 0x18),(internal *)local_578,
                   (AssertionResult *)"static_cast<bool> (s3)","false","true",in_R9);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_5a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                   ,0x8f,pcVar7);
        testing::internal::AssertHelper::operator=(&local_5a0,pMVar4);
        testing::internal::AssertHelper::~AssertHelper(&local_5a0);
        std::__cxx11::string::~string((string *)(str3.storage_.__data + 0x18));
        testing::Message::~Message(&local_588);
      }
      str1.storage_._29_3_ = 0;
      str1.storage_.__data[0x1c] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
      if (str1.storage_._28_4_ == 0) {
        pstore::
        maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        ::maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 *)local_5e8);
        ptVar5 = pstore::
                 error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                 ::operator*((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                              *)&gtest_ar__4.message_);
        std::tie<int,pstore::maybe<std::__cxx11::string,void>>
                  ((int *)&gtest_ar__5.message_,
                   (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                    *)&br.is_eof_);
        std::tuple<int&,pstore::maybe<std::__cxx11::string,void>&>::operator=
                  ((tuple<int&,pstore::maybe<std::__cxx11::string,void>&> *)&gtest_ar__5.message_,
                   ptVar5);
        local_609 = pstore::
                    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                    ::has_value((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                                 *)local_5e8);
        local_609 = !local_609;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_608,&local_609,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
        if (!bVar1) {
          testing::Message::Message(&local_618);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_640,(internal *)local_608,(AssertionResult *)"str3.has_value ()","true",
                     "false",in_R9);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_620,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                     ,0x93,pcVar7);
          testing::internal::AssertHelper::operator=(&local_620,&local_618);
          testing::internal::AssertHelper::~AssertHelper(&local_620);
          std::__cxx11::string::~string((string *)&local_640);
          testing::Message::~Message(&local_618);
        }
        str1.storage_._29_3_ = 0;
        str1.storage_.__data[0x1c] = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
        if (str1.storage_._28_4_ == 0) {
          str1.storage_._28_4_ = 0;
        }
        pstore::
        maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        ::~maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *)local_5e8);
      }
      pstore::
      error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
      ::~error_or((error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                   *)&gtest_ar__4.message_);
      if (str1.storage_._28_4_ == 0) {
        str1.storage_._28_4_ = 0;
      }
    }
  }
  pstore::http::
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::~buffered_reader((buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                      *)local_2a8);
  refiller::~refiller((refiller *)local_60);
  return;
}

Assistant:

TEST (HttpdBufferedReader, StringCRLF) {
    refiller r;
    EXPECT_CALL (r, fill (_, _)).WillRepeatedly (Invoke (eof ()));
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("abc\r\ndef")));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    {
        gets_result_type const s1 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s1))
            << "There was an unexpected error: " << s1.get_error ();
        maybe<std::string> str1;
        std::tie (io, str1) = *s1;
        ASSERT_TRUE (str1.has_value ());
        EXPECT_EQ (str1.value (), "abc");
    }
    {
        gets_result_type const s2 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s2))
            << "There was an unexpected error: " << s2.get_error ();
        maybe<std::string> str2;
        std::tie (io, str2) = *s2;
        ASSERT_TRUE (str2.has_value ());
        EXPECT_EQ (str2.value (), "def");
    }
    {
        gets_result_type const s3 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s3))
            << "There was an unexpected error: " << s3.get_error ();
        maybe<std::string> str3;
        std::tie (io, str3) = *s3;
        ASSERT_FALSE (str3.has_value ());
    }
}